

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TikzPlotter.cpp
# Opt level: O0

bool __thiscall vectorgraphics::TikzPlotter::createTexFile(TikzPlotter *this,path *tex_path)

{
  byte bVar1;
  basic_ostream<char,_std::char_traits<char>_> *this_00;
  ostream *poVar2;
  long lVar3;
  string local_270 [32];
  string local_250 [32];
  undefined4 local_230;
  long local_220;
  ofstream ofs;
  path *tex_path_local;
  TikzPlotter *this_local;
  
  std::ofstream::ofstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            ((ofstream *)&local_220,tex_path,_S_out);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&local_220,"\\documentclass[]{standalone}");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&local_220,"\\usepackage[subpreambles=true]{standalone}");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&local_220,"\\usepackage{tikz}");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&local_220,"\\begin{document}");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::stringstream::str();
    lVar3 = std::__cxx11::string::size();
    std::__cxx11::string::~string(local_250);
    if (lVar3 != 0) {
      poVar2 = std::operator<<((ostream *)&local_220,"\\begin{tikzpicture}");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::stringstream::str();
      std::operator<<((ostream *)&local_220,local_270);
      std::__cxx11::string::~string(local_270);
      poVar2 = std::operator<<((ostream *)&local_220,"\\end{tikzpicture}");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    poVar2 = std::operator<<((ostream *)&local_220,"\\end{document}");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::ofstream::close();
    this_local._7_1_ = true;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Error in createTexFile: opening output file at "
                            );
    this_00 = std::filesystem::__cxx11::operator<<(poVar2,tex_path);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  local_230 = 1;
  std::ofstream::~ofstream(&local_220);
  return this_local._7_1_;
}

Assistant:

bool TikzPlotter::createTexFile(std::filesystem::path tex_path) const {
    std::ofstream ofs(tex_path);

    if (!ofs) {
      std::cout << "Error in createTexFile: opening output file at " << tex_path << std::endl;
      return false;
    }

    ofs << R"(\documentclass[]{standalone})" << std::endl;
    ofs << R"(\usepackage[subpreambles=true]{standalone})" << std::endl;
    ofs << R"(\usepackage{tikz})" << std::endl;
    ofs << R"(\begin{document})" << std::endl;

    if (content.str().size() != 0) {
      ofs << R"(\begin{tikzpicture})" << std::endl;

      ofs << content.str();

      ofs << R"(\end{tikzpicture})" << std::endl;
    }
    ofs << R"(\end{document})" << std::endl;

    ofs.close();
    return true;
  }